

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::ValueImpl<true>::ValueImpl<char_const(&)[20],void>
          (ValueImpl<true> *this,char (*value) [20])

{
  bool bVar1;
  allocator<char> local_39;
  string local_38 [32];
  char (*local_18) [20];
  char (*value_local) [20];
  ValueImpl<true> *this_local;
  
  local_18 = value;
  value_local = (char (*) [20])this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,*value,&local_39);
  ToStringOrCallback(this,this,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)&this->consume_after);
  this->consume_parens_if_empty = false;
  bVar1 = std::holds_alternative<std::function<bool()>,std::__cxx11::string,std::function<bool()>>
                    (&this->value);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->consume_after,";,");
  }
  return;
}

Assistant:

ValueImpl(Value&& value)  // NOLINT
      : value(ToStringOrCallback(std::forward<Value>(value), Rank2{})) {
    if (std::holds_alternative<Callback>(this->value)) {
      consume_after = ";,";
    }
  }